

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

cmDocumentationEntry * cmGlobalNinjaMultiGenerator::GetDocumentation(void)

{
  cmDocumentationEntry *in_RDI;
  allocator<char> local_11 [9];
  
  GetActualName_abi_cxx11_();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&in_RDI->Brief,"Generates build-<Config>.ninja files.",local_11);
  in_RDI->CustomNamePrefix = ' ';
  std::allocator<char>::~allocator(local_11);
  return in_RDI;
}

Assistant:

cmDocumentationEntry cmGlobalNinjaMultiGenerator::GetDocumentation()
{
  return { cmGlobalNinjaMultiGenerator::GetActualName(),
           "Generates build-<Config>.ninja files." };
}